

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O1

void reactname(Item *q1,Item *lastok,Item *q2)

{
  Symbol *s;
  Rterm *pRVar1;
  int iVar2;
  Rterm *pRVar3;
  Symbol *pSVar4;
  char *pcVar5;
  
  pRVar1 = rterm;
  pRVar3 = (Rterm *)emalloc(0x20);
  rterm = pRVar3;
  pRVar3->rnext = pRVar1;
  pRVar3->isstate = 0;
  s = (q1->element).sym;
  if ((s->subtype & 0x10) != 0) {
    iVar2 = in_solvefor(s);
    if (iVar2 != 0) {
      sprintf(buf,"D%s",s->name);
      pSVar4 = lookup(buf);
      *(byte *)&pSVar4->usage = (byte)pSVar4->usage | 8;
      s->used = s->used + 1;
      rterm->isstate = 1;
      goto LAB_0010daa1;
    }
  }
  if ((s->subtype & 0x8201e) == 0) {
    diag(s->name," must be a STATE, CONSTANT, ASSIGNED, STEPPED, or INDEPENDENT");
  }
LAB_0010daa1:
  if (q2 == (Item *)0x0) {
    iVar2 = 1;
  }
  else {
    iVar2 = atoi((q2->element).str);
  }
  rterm->num = iVar2;
  if (q1 == lastok) {
    pcVar5 = (char *)0x0;
  }
  else {
    if ((s->subtype & 0x20) == 0) {
      diag("REACTION: MUST be scalar or array",(char *)0x0);
    }
    pcVar5 = qconcat(q1->next->next,lastok->prev);
  }
  pRVar1 = rterm;
  rterm->str = pcVar5;
  pRVar1->sym = s;
  return;
}

Assistant:

void reactname(q1, lastok, q2) /* NAME [] INTEGER   q2 may be null*/
	Item *q1, *lastok, *q2;
{	/* put on right hand side */
	Symbol *s, *s1;
	Rterm *rnext;

	rnext = rterm;
	rterm = (Rterm *)emalloc(sizeof(Rterm));
	rterm->rnext = rnext;
	rterm->isstate = 0;
	s = SYM(q1);
	if ((s->subtype & STAT) && in_solvefor(s)) {
		Sprintf(buf, "D%s", s->name);
		s1 = lookup(buf);
		s1->usage |= DEP;
		s->used++;
		rterm->isstate = 1;
	} else if (!(s->subtype & (DEP | nmodlCONST | PARM | INDEP | STEP1 | STAT)) ) {
diag(s->name, " must be a STATE, CONSTANT, ASSIGNED, STEPPED, or INDEPENDENT");
	}
	if (q2) {
		rterm->num = atoi(STR(q2));
	}else{
		rterm->num = 1;
	}
	if (q1 != lastok) {
		if(!(s->subtype & ARRAY)) {
			diag("REACTION: MUST be scalar or array", (char *)0);
		}
		rterm->str = qconcat(q1->next->next, lastok->prev);
/* one too many parentheses since normally a *( is prepended to the name
during output in cout.c.  Therefore when used to construct a MATELM or RHS
extra parentheses must be prepended as in MATELM((...,(....
*/ /* this no longer holds, no parentheses are to be prepended */
	} else {
		rterm->str = (char *)0;
	}
	rterm->sym = s;
}